

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,TableIndexField *table_i_field,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  undefined8 local_24;
  undefined1 local_1c;
  
  local_24 = 1;
  local_1c = 0;
  pSVar1 = (table_i_field->index_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_24);
  pSVar1 = (table_i_field->value_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_24);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(TableIndexField *table_i_field, void *data)
    {
        // Table index_ and value_ expressions are read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        table_i_field->index_->Accept(this, &exp_var_data);
        table_i_field->value_->Accept(this, &exp_var_data);
    }